

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong *puVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  undefined8 unaff_R12;
  ulong uVar31;
  Geometry *geometry;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar37 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  vint4 ai_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  float fVar59;
  float fVar64;
  float fVar65;
  vint4 ai_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar66;
  vint4 ai;
  undefined1 auVar67 [16];
  vint4 ai_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 ai_4;
  undefined1 auVar73 [16];
  vint4 ai_6;
  undefined1 auVar74 [16];
  float fVar75;
  float fVar77;
  float fVar78;
  undefined1 auVar76 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [32];
  float fVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  ulong *local_c68;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  byte local_9ff;
  float local_9e0 [4];
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar92 = ZEXT1664(auVar33);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar93 = ZEXT1664(auVar34);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x40)));
  auVar94 = ZEXT1664(auVar35);
  auVar33 = vmulss_avx512f(auVar33,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar36._0_4_ = auVar33._0_4_;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  auVar33 = vmulss_avx512f(auVar34,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar34._0_4_ = auVar33._0_4_;
  auVar34._4_4_ = auVar34._0_4_;
  auVar34._8_4_ = auVar34._0_4_;
  auVar34._12_4_ = auVar34._0_4_;
  auVar33 = vmulss_avx512f(auVar35,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x40)));
  auVar35._0_4_ = auVar33._0_4_;
  auVar35._4_4_ = auVar35._0_4_;
  auVar35._8_4_ = auVar35._0_4_;
  auVar35._12_4_ = auVar35._0_4_;
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar33 = vxorps_avx512vl(auVar36,auVar68);
  auVar95 = ZEXT1664(auVar33);
  auVar33 = vxorps_avx512vl(auVar34,auVar68);
  auVar96 = ZEXT1664(auVar33);
  auVar33 = vxorps_avx512vl(auVar35,auVar68);
  auVar97 = ZEXT1664(auVar33);
  auVar33 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar98 = ZEXT1664(auVar33);
  auVar33 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar99 = ZEXT1664(auVar33);
  auVar33 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar100 = ZEXT1664(auVar33);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar101 = ZEXT3264(auVar38);
  auVar38 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar102 = ZEXT3264(auVar38);
  local_c68 = local_7f8;
LAB_01d63aaa:
  do {
    puVar21 = local_c68;
    if (puVar21 == &local_800) {
LAB_01d64541:
      return puVar21 != &local_800;
    }
    local_c68 = puVar21 + -1;
    uVar31 = puVar21[-1];
    while ((uVar31 & 8) == 0) {
      auVar33 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + uVar26),auVar95._0_16_,
                           auVar92._0_16_);
      auVar34 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + uVar27),auVar96._0_16_,
                           auVar93._0_16_);
      auVar33 = vpmaxsd_avx(auVar33,auVar34);
      auVar35 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + uVar28),auVar97._0_16_,
                           auVar94._0_16_);
      auVar34 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar26 ^ 0x10)),auVar95._0_16_,
                           auVar92._0_16_);
      auVar36 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar27 ^ 0x10)),auVar96._0_16_,
                           auVar93._0_16_);
      auVar34 = vpminsd_avx(auVar34,auVar36);
      auVar36 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar28 ^ 0x10)),auVar97._0_16_,
                           auVar94._0_16_);
      auVar35 = vpmaxsd_avx512vl(auVar35,auVar98._0_16_);
      auVar33 = vpmaxsd_avx(auVar33,auVar35);
      auVar35 = vpminsd_avx512vl(auVar36,auVar99._0_16_);
      auVar34 = vpminsd_avx(auVar34,auVar35);
      uVar32 = vpcmpd_avx512vl(auVar33,auVar34,2);
      uVar32 = uVar32 & 0xf;
      if ((char)uVar32 == '\0') goto LAB_01d63aaa;
      uVar17 = uVar31 & 0xfffffffffffffff0;
      lVar19 = 0;
      for (uVar31 = uVar32; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar31 = *(ulong *)(uVar17 + lVar19 * 8);
      uVar20 = (uint)uVar32 - 1 & (uint)uVar32;
      uVar32 = (ulong)uVar20;
      if (uVar20 != 0) {
        do {
          *local_c68 = uVar31;
          local_c68 = local_c68 + 1;
          lVar19 = 0;
          for (uVar31 = uVar32; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar32 = uVar32 - 1 & uVar32;
          uVar31 = *(ulong *)(uVar17 + lVar19 * 8);
        } while (uVar32 != 0);
      }
    }
    uVar32 = uVar31 & 0xfffffffffffffff0;
    for (lVar19 = 0; lVar19 != (ulong)((uint)uVar31 & 0xf) - 8; lVar19 = lVar19 + 1) {
      lVar18 = lVar19 * 0x58;
      lVar1 = lVar18 + uVar32;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(uVar32 + 0x20 + lVar18);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(uVar32 + 0x24 + lVar18);
      uVar10 = vpcmpub_avx512vl(auVar33,auVar37,2);
      uVar2 = *(undefined4 *)(uVar32 + 0x38 + lVar18);
      auVar54._4_4_ = uVar2;
      auVar54._0_4_ = uVar2;
      auVar54._8_4_ = uVar2;
      auVar54._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar32 + 0x44 + lVar18);
      auVar60._4_4_ = uVar2;
      auVar60._0_4_ = uVar2;
      auVar60._8_4_ = uVar2;
      auVar60._12_4_ = uVar2;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)((uVar26 >> 2) + 0x20 + lVar1);
      auVar33 = vpmovzxbd_avx(auVar67);
      auVar33 = vcvtdq2ps_avx(auVar33);
      auVar34 = vfmadd213ps_fma(auVar33,auVar60,auVar54);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)(((uVar26 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar33 = vpmovzxbd_avx(auVar69);
      auVar33 = vcvtdq2ps_avx(auVar33);
      auVar35 = vfmadd213ps_fma(auVar33,auVar60,auVar54);
      uVar2 = *(undefined4 *)(uVar32 + 0x3c + lVar18);
      auVar55._4_4_ = uVar2;
      auVar55._0_4_ = uVar2;
      auVar55._8_4_ = uVar2;
      auVar55._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar32 + 0x48 + lVar18);
      auVar61._4_4_ = uVar2;
      auVar61._0_4_ = uVar2;
      auVar61._8_4_ = uVar2;
      auVar61._12_4_ = uVar2;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)((uVar27 >> 2) + 0x20 + lVar1);
      auVar33 = vpmovzxbd_avx(auVar71);
      auVar33 = vcvtdq2ps_avx(auVar33);
      auVar36 = vfmadd213ps_fma(auVar33,auVar61,auVar55);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(((uVar27 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar33 = vpmovzxbd_avx(auVar72);
      auVar33 = vcvtdq2ps_avx(auVar33);
      auVar68 = vfmadd213ps_fma(auVar33,auVar61,auVar55);
      uVar2 = *(undefined4 *)(uVar32 + 0x40 + lVar18);
      auVar56._4_4_ = uVar2;
      auVar56._0_4_ = uVar2;
      auVar56._8_4_ = uVar2;
      auVar56._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar32 + 0x4c + lVar18);
      auVar62._4_4_ = uVar2;
      auVar62._0_4_ = uVar2;
      auVar62._8_4_ = uVar2;
      auVar62._12_4_ = uVar2;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)((uVar28 >> 2) + 0x20 + lVar1);
      auVar33 = vpmovzxbd_avx(auVar73);
      auVar33 = vcvtdq2ps_avx(auVar33);
      auVar54 = vfmadd213ps_fma(auVar33,auVar62,auVar56);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(ulong *)(((uVar28 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar33 = vpmovzxbd_avx(auVar74);
      auVar33 = vcvtdq2ps_avx(auVar33);
      auVar55 = vfmadd213ps_fma(auVar33,auVar62,auVar56);
      auVar33 = vfmadd213ps_avx512vl(auVar34,auVar92._0_16_,auVar95._0_16_);
      auVar34 = vfmadd213ps_avx512vl(auVar36,auVar93._0_16_,auVar96._0_16_);
      auVar33 = vpmaxsd_avx(auVar33,auVar34);
      auVar36 = vfmadd213ps_avx512vl(auVar54,auVar94._0_16_,auVar97._0_16_);
      auVar34 = vfmadd213ps_avx512vl(auVar35,auVar92._0_16_,auVar95._0_16_);
      auVar35 = vfmadd213ps_avx512vl(auVar68,auVar93._0_16_,auVar96._0_16_);
      auVar34 = vpminsd_avx(auVar34,auVar35);
      auVar35 = vfmadd213ps_avx512vl(auVar55,auVar94._0_16_,auVar97._0_16_);
      auVar36 = vpmaxsd_avx512vl(auVar36,auVar98._0_16_);
      auVar33 = vpmaxsd_avx(auVar33,auVar36);
      auVar35 = vpminsd_avx512vl(auVar35,auVar99._0_16_);
      auVar34 = vpminsd_avx(auVar34,auVar35);
      uVar11 = vpcmpd_avx512vl(auVar33,auVar34,2);
      for (uVar17 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),
                             (uint)((byte)uVar10 & 0xf & (byte)uVar11)); uVar17 != 0;
          uVar17 = uVar17 - 1 & uVar17) {
        lVar18 = 0;
        for (uVar25 = uVar17; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          lVar18 = lVar18 + 1;
        }
        pGVar3 = (context->scene->geometries).items[*(uint *)(lVar1 + 0x50)].ptr;
        lVar4 = *(long *)&pGVar3->field_0x58;
        lVar5 = *(long *)&pGVar3[1].time_range.upper;
        lVar24 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)*(uint *)(lVar1 + 4 + lVar18 * 8);
        uVar25 = *(ulong *)(lVar1 + lVar18 * 8);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar25;
        auVar33 = vpandq_avx512vl(auVar57,auVar100._0_16_);
        auVar54 = vpmovzxwd_avx(auVar33);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(lVar4 + lVar24);
        auVar33 = vpaddd_avx(auVar63,auVar54);
        auVar34 = vpmulld_avx(auVar63,auVar54);
        auVar34 = vpsrlq_avx(auVar34,0x20);
        auVar33 = vpaddd_avx(auVar33,auVar34);
        lVar23 = CONCAT44((int)((ulong)lVar1 >> 0x20),auVar33._0_4_);
        p_Var6 = pGVar3[1].intersectionFilterN;
        auVar33 = *(undefined1 (*) [16])(lVar5 + (lVar23 + 1) * (long)p_Var6);
        uVar29 = *(ulong *)(lVar4 + lVar24) >> 0x20;
        lVar30 = lVar23 + uVar29 + 1;
        auVar34 = *(undefined1 (*) [16])(lVar5 + (lVar23 + uVar29) * (long)p_Var6);
        auVar35 = *(undefined1 (*) [16])(lVar5 + lVar30 * (long)p_Var6);
        uVar22 = (ulong)(-1 < (short)uVar25);
        auVar36 = *(undefined1 (*) [16])(lVar5 + (lVar23 + uVar22 + 1) * (long)p_Var6);
        lVar18 = uVar22 + lVar30;
        auVar68 = *(undefined1 (*) [16])(lVar5 + lVar18 * (long)p_Var6);
        uVar22 = 0;
        if (-1 < (short)(uVar25 >> 0x10)) {
          uVar22 = uVar29;
        }
        auVar55 = *(undefined1 (*) [16])(lVar5 + (lVar23 + uVar29 + uVar22) * (long)p_Var6);
        auVar56 = *(undefined1 (*) [16])(lVar5 + (lVar30 + uVar22) * (long)p_Var6);
        auVar79._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar22 + lVar18) * (long)p_Var6);
        auVar79._0_16_ = auVar35;
        auVar60 = vunpcklps_avx(auVar33,auVar68);
        auVar37 = vunpckhps_avx(auVar33,auVar68);
        auVar61 = vunpcklps_avx(auVar36,auVar35);
        auVar36 = vunpckhps_avx(auVar36,auVar35);
        auVar62 = vunpcklps_avx(auVar37,auVar36);
        auVar67 = vunpcklps_avx(auVar60,auVar61);
        auVar36 = vunpckhps_avx(auVar60,auVar61);
        auVar60 = vunpcklps_avx(auVar34,auVar56);
        auVar37 = vunpckhps_avx(auVar34,auVar56);
        auVar61 = vunpcklps_avx(auVar35,auVar55);
        auVar55 = vunpckhps_avx(auVar35,auVar55);
        auVar37 = vunpcklps_avx(auVar37,auVar55);
        auVar69 = vunpcklps_avx(auVar60,auVar61);
        auVar55 = vunpckhps_avx(auVar60,auVar61);
        auVar49._16_16_ = auVar56;
        auVar49._0_16_ = auVar34;
        auVar50._16_16_ = auVar68;
        auVar50._0_16_ = auVar33;
        auVar38 = vunpcklps_avx(auVar50,auVar49);
        auVar51._16_16_ = auVar35;
        auVar51._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * lVar23);
        auVar52 = vunpcklps_avx(auVar51,auVar79);
        auVar42 = vunpcklps_avx(auVar52,auVar38);
        auVar43 = vunpckhps_avx(auVar52,auVar38);
        auVar38 = vunpckhps_avx(auVar50,auVar49);
        auVar52 = vunpckhps_avx(auVar51,auVar79);
        auVar44 = vunpcklps_avx(auVar52,auVar38);
        auVar38._16_16_ = auVar67;
        auVar38._0_16_ = auVar67;
        auVar52._16_16_ = auVar36;
        auVar52._0_16_ = auVar36;
        auVar48._16_16_ = auVar62;
        auVar48._0_16_ = auVar62;
        auVar46._16_16_ = auVar69;
        auVar46._0_16_ = auVar69;
        auVar80._16_16_ = auVar55;
        auVar80._0_16_ = auVar55;
        auVar47._16_16_ = auVar37;
        auVar47._0_16_ = auVar37;
        auVar38 = vsubps_avx(auVar42,auVar38);
        auVar52 = vsubps_avx(auVar43,auVar52);
        auVar51 = vsubps_avx(auVar44,auVar48);
        auVar50 = vsubps_avx(auVar46,auVar42);
        auVar49 = vsubps_avx(auVar80,auVar43);
        auVar48 = vsubps_avx(auVar47,auVar44);
        auVar39._4_4_ = auVar52._4_4_ * auVar48._4_4_;
        auVar39._0_4_ = auVar52._0_4_ * auVar48._0_4_;
        auVar39._8_4_ = auVar52._8_4_ * auVar48._8_4_;
        auVar39._12_4_ = auVar52._12_4_ * auVar48._12_4_;
        auVar39._16_4_ = auVar52._16_4_ * auVar48._16_4_;
        auVar39._20_4_ = auVar52._20_4_ * auVar48._20_4_;
        auVar39._24_4_ = auVar52._24_4_ * auVar48._24_4_;
        auVar39._28_4_ = auVar36._12_4_;
        auVar33 = vfmsub231ps_fma(auVar39,auVar49,auVar51);
        auVar40._4_4_ = auVar51._4_4_ * auVar50._4_4_;
        auVar40._0_4_ = auVar51._0_4_ * auVar50._0_4_;
        auVar40._8_4_ = auVar51._8_4_ * auVar50._8_4_;
        auVar40._12_4_ = auVar51._12_4_ * auVar50._12_4_;
        auVar40._16_4_ = auVar51._16_4_ * auVar50._16_4_;
        auVar40._20_4_ = auVar51._20_4_ * auVar50._20_4_;
        auVar40._24_4_ = auVar51._24_4_ * auVar50._24_4_;
        auVar40._28_4_ = auVar62._12_4_;
        auVar34 = vfmsub231ps_fma(auVar40,auVar48,auVar38);
        auVar45._4_4_ = auVar38._4_4_ * auVar49._4_4_;
        auVar45._0_4_ = auVar38._0_4_ * auVar49._0_4_;
        auVar45._8_4_ = auVar38._8_4_ * auVar49._8_4_;
        auVar45._12_4_ = auVar38._12_4_ * auVar49._12_4_;
        auVar45._16_4_ = auVar38._16_4_ * auVar49._16_4_;
        auVar45._20_4_ = auVar38._20_4_ * auVar49._20_4_;
        auVar45._24_4_ = auVar38._24_4_ * auVar49._24_4_;
        auVar45._28_4_ = auVar69._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar83._4_4_ = uVar2;
        auVar83._0_4_ = uVar2;
        auVar83._8_4_ = uVar2;
        auVar83._12_4_ = uVar2;
        auVar83._16_4_ = uVar2;
        auVar83._20_4_ = uVar2;
        auVar83._24_4_ = uVar2;
        auVar83._28_4_ = uVar2;
        auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
        auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar41._4_4_ = uVar2;
        auVar41._0_4_ = uVar2;
        auVar41._8_4_ = uVar2;
        auVar41._12_4_ = uVar2;
        auVar41._16_4_ = uVar2;
        auVar41._20_4_ = uVar2;
        auVar41._24_4_ = uVar2;
        auVar41._28_4_ = uVar2;
        auVar41 = vsubps_avx512vl(auVar42,auVar41);
        auVar35 = vfmsub231ps_fma(auVar45,auVar50,auVar52);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar42._4_4_ = uVar2;
        auVar42._0_4_ = uVar2;
        auVar42._8_4_ = uVar2;
        auVar42._12_4_ = uVar2;
        auVar42._16_4_ = uVar2;
        auVar42._20_4_ = uVar2;
        auVar42._24_4_ = uVar2;
        auVar42._28_4_ = uVar2;
        auVar42 = vsubps_avx512vl(auVar43,auVar42);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar43._4_4_ = uVar2;
        auVar43._0_4_ = uVar2;
        auVar43._8_4_ = uVar2;
        auVar43._12_4_ = uVar2;
        auVar43._16_4_ = uVar2;
        auVar43._20_4_ = uVar2;
        auVar43._24_4_ = uVar2;
        auVar43._28_4_ = uVar2;
        auVar43 = vsubps_avx512vl(auVar44,auVar43);
        auVar44 = vmulps_avx512vl(auVar39,auVar43);
        auVar45 = vfmsub231ps_avx512vl(auVar44,auVar42,auVar40);
        auVar44 = vmulps_avx512vl(auVar40,auVar41);
        auVar46 = vfmsub231ps_avx512vl(auVar44,auVar43,auVar83);
        auVar44 = vmulps_avx512vl(auVar83,auVar42);
        auVar47 = vfmsub231ps_avx512vl(auVar44,auVar41,auVar39);
        auVar44 = vmulps_avx512vl(ZEXT1632(auVar35),auVar40);
        auVar44 = vfmadd231ps_avx512vl(auVar44,ZEXT1632(auVar34),auVar39);
        local_a20 = vfmadd231ps_avx512vl(auVar44,ZEXT1632(auVar33),auVar83);
        vandps_avx512vl(local_a20,auVar101._0_32_);
        auVar44._8_4_ = 0x80000000;
        auVar44._0_8_ = 0x8000000080000000;
        auVar44._12_4_ = 0x80000000;
        auVar44._16_4_ = 0x80000000;
        auVar44._20_4_ = 0x80000000;
        auVar44._24_4_ = 0x80000000;
        auVar44._28_4_ = 0x80000000;
        vandps_avx512vl(local_a20,auVar44);
        auVar48 = vmulps_avx512vl(auVar48,auVar47);
        auVar49 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar49);
        auVar50 = vfmadd231ps_avx512vl(auVar49,auVar45,auVar50);
        fVar82 = local_a20._0_4_;
        auVar76._0_4_ = (float)((uint)fVar82 ^ auVar50._0_4_);
        fVar84 = local_a20._4_4_;
        auVar76._4_4_ = (float)((uint)fVar84 ^ auVar50._4_4_);
        fVar85 = local_a20._8_4_;
        auVar76._8_4_ = (float)((uint)fVar85 ^ auVar50._8_4_);
        fVar86 = local_a20._12_4_;
        auVar76._12_4_ = (float)((uint)fVar86 ^ auVar50._12_4_);
        fVar87 = local_a20._16_4_;
        auVar76._16_4_ = (float)((uint)fVar87 ^ auVar50._16_4_);
        fVar88 = local_a20._20_4_;
        auVar76._20_4_ = (float)((uint)fVar88 ^ auVar50._20_4_);
        fVar89 = local_a20._24_4_;
        auVar76._24_4_ = (float)((uint)fVar89 ^ auVar50._24_4_);
        uVar20 = local_a20._28_4_;
        auVar76._28_4_ = (float)(uVar20 ^ auVar50._28_4_);
        auVar51 = vmulps_avx512vl(auVar51,auVar47);
        auVar52 = vfmadd231ps_avx512vl(auVar51,auVar52,auVar46);
        auVar38 = vfmadd231ps_avx512vl(auVar52,auVar38,auVar45);
        auVar81._0_4_ = (float)((uint)fVar82 ^ auVar38._0_4_);
        auVar81._4_4_ = (float)((uint)fVar84 ^ auVar38._4_4_);
        auVar81._8_4_ = (float)((uint)fVar85 ^ auVar38._8_4_);
        auVar81._12_4_ = (float)((uint)fVar86 ^ auVar38._12_4_);
        auVar81._16_4_ = (float)((uint)fVar87 ^ auVar38._16_4_);
        auVar81._20_4_ = (float)((uint)fVar88 ^ auVar38._20_4_);
        auVar81._24_4_ = (float)((uint)fVar89 ^ auVar38._24_4_);
        auVar81._28_4_ = (float)(uVar20 ^ auVar38._28_4_);
        uVar10 = vcmpps_avx512vl(auVar76,ZEXT832(0) << 0x20,5);
        uVar11 = vcmpps_avx512vl(auVar81,ZEXT832(0) << 0x20,5);
        uVar8 = vcmpps_avx512vl(local_a20,ZEXT832(0) << 0x20,4);
        auVar91._0_4_ = auVar76._0_4_ + auVar81._0_4_;
        auVar91._4_4_ = auVar76._4_4_ + auVar81._4_4_;
        auVar91._8_4_ = auVar76._8_4_ + auVar81._8_4_;
        auVar91._12_4_ = auVar76._12_4_ + auVar81._12_4_;
        auVar91._16_4_ = auVar76._16_4_ + auVar81._16_4_;
        auVar91._20_4_ = auVar76._20_4_ + auVar81._20_4_;
        auVar91._24_4_ = auVar76._24_4_ + auVar81._24_4_;
        auVar91._28_4_ = auVar76._28_4_ + auVar81._28_4_;
        uVar9 = vcmpps_avx512vl(auVar91,local_a20,2);
        local_9ff = (byte)uVar10 & (byte)uVar11 & (byte)uVar8 & (byte)uVar9;
        if (local_9ff != 0) {
          auVar14._4_4_ = auVar35._4_4_ * auVar43._4_4_;
          auVar14._0_4_ = auVar35._0_4_ * auVar43._0_4_;
          auVar14._8_4_ = auVar35._8_4_ * auVar43._8_4_;
          auVar14._12_4_ = auVar35._12_4_ * auVar43._12_4_;
          auVar14._16_4_ = auVar43._16_4_ * 0.0;
          auVar14._20_4_ = auVar43._20_4_ * 0.0;
          auVar14._24_4_ = auVar43._24_4_ * 0.0;
          auVar14._28_4_ = auVar43._28_4_;
          auVar36 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar34),auVar14);
          auVar36 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar33),ZEXT1632(auVar36));
          local_a40._0_4_ = (float)((uint)fVar82 ^ auVar36._0_4_);
          local_a40._4_4_ = (float)((uint)fVar84 ^ auVar36._4_4_);
          local_a40._8_4_ = (float)((uint)fVar85 ^ auVar36._8_4_);
          local_a40._12_4_ = (float)((uint)fVar86 ^ auVar36._12_4_);
          local_a40._16_4_ = fVar87;
          local_a40._20_4_ = fVar88;
          local_a40._24_4_ = fVar89;
          local_a40._28_4_ = uVar20;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar12._4_4_ = uVar2;
          auVar12._0_4_ = uVar2;
          auVar12._8_4_ = uVar2;
          auVar12._12_4_ = uVar2;
          auVar12._16_4_ = uVar2;
          auVar12._20_4_ = uVar2;
          auVar12._24_4_ = uVar2;
          auVar12._28_4_ = uVar2;
          auVar38 = vmulps_avx512vl(local_a20,auVar12);
          uVar10 = vcmpps_avx512vl(auVar38,local_a40,1);
          fVar90 = *(float *)(ray + k * 4 + 0x100);
          auVar15._4_4_ = fVar90 * fVar84;
          auVar15._0_4_ = fVar90 * fVar82;
          auVar15._8_4_ = fVar90 * fVar85;
          auVar15._12_4_ = fVar90 * fVar86;
          auVar15._16_4_ = fVar90 * fVar87;
          auVar15._20_4_ = fVar90 * fVar88;
          auVar15._24_4_ = fVar90 * fVar89;
          auVar15._28_4_ = auVar38._28_4_;
          uVar11 = vcmpps_avx512vl(local_a40,auVar15,2);
          local_9ff = (byte)uVar10 & (byte)uVar11 & local_9ff;
          if (local_9ff != 0) {
            auVar38 = vsubps_avx(local_a20,auVar81);
            local_a80 = vblendps_avx(auVar76,auVar38,0xf0);
            auVar38 = vsubps_avx(local_a20,auVar76);
            local_a60 = vblendps_avx(auVar81,auVar38,0xf0);
            fVar75 = (float)DAT_01fbac00;
            local_980._0_4_ = fVar75 * auVar33._0_4_;
            fVar77 = DAT_01fbac00._4_4_;
            local_980._4_4_ = fVar77 * auVar33._4_4_;
            fVar59 = DAT_01fbac00._8_4_;
            local_980._8_4_ = fVar59 * auVar33._8_4_;
            fVar64 = DAT_01fbac00._12_4_;
            local_980._12_4_ = fVar64 * auVar33._12_4_;
            fVar65 = DAT_01fbac00._16_4_;
            local_980._16_4_ = fVar65 * 0.0;
            fVar66 = DAT_01fbac00._20_4_;
            local_980._20_4_ = fVar66 * 0.0;
            fVar78 = DAT_01fbac00._24_4_;
            local_980._24_4_ = fVar78 * 0.0;
            local_980._28_4_ = 0;
            local_960._4_4_ = fVar77 * auVar34._4_4_;
            local_960._0_4_ = fVar75 * auVar34._0_4_;
            local_960._8_4_ = fVar59 * auVar34._8_4_;
            local_960._12_4_ = fVar64 * auVar34._12_4_;
            local_960._16_4_ = fVar65 * 0.0;
            local_960._20_4_ = fVar66 * 0.0;
            local_960._24_4_ = fVar78 * 0.0;
            local_960._28_4_ = 0;
            local_940._4_4_ = fVar77 * auVar35._4_4_;
            local_940._0_4_ = fVar75 * auVar35._0_4_;
            local_940._8_4_ = fVar59 * auVar35._8_4_;
            local_940._12_4_ = fVar64 * auVar35._12_4_;
            local_940._16_4_ = fVar65 * 0.0;
            local_940._20_4_ = fVar66 * 0.0;
            local_940._24_4_ = fVar78 * 0.0;
            local_940._28_4_ = 0;
            if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01d64530:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_01d64541;
              }
              auVar70._8_4_ = 1;
              auVar70._0_8_ = 0x100000001;
              auVar70._12_4_ = 1;
              auVar70._16_4_ = 1;
              auVar70._20_4_ = 1;
              auVar70._24_4_ = 1;
              auVar70._28_4_ = 1;
              auVar38 = vpermd_avx2(auVar70,ZEXT1632(auVar54));
              auVar52 = vpaddd_avx2(auVar38,_DAT_01fb7760);
              auVar58._0_4_ = auVar54._0_4_;
              auVar58._4_4_ = auVar58._0_4_;
              auVar58._8_4_ = auVar58._0_4_;
              auVar58._12_4_ = auVar58._0_4_;
              auVar58._16_4_ = auVar58._0_4_;
              auVar58._20_4_ = auVar58._0_4_;
              auVar58._24_4_ = auVar58._0_4_;
              auVar58._28_4_ = auVar58._0_4_;
              auVar38 = vpaddd_avx2(auVar58,_DAT_01fb7740);
              auVar35 = auVar92._0_16_;
              auVar33 = vcvtsi2ss_avx512f(auVar35,*(ushort *)(lVar4 + 8 + lVar24) - 1);
              auVar16._12_4_ = 0;
              auVar16._0_12_ = ZEXT812(0);
              auVar34 = vrcp14ss_avx512f(auVar16 << 0x20,ZEXT416(auVar33._0_4_));
              auVar33 = vfnmadd213ss_fma(auVar33,auVar34,SUB6416(ZEXT464(0x40000000),0));
              fVar75 = auVar34._0_4_ * auVar33._0_4_;
              auVar33 = vcvtsi2ss_avx512f(auVar35,*(ushort *)(lVar4 + 10 + lVar24) - 1);
              auVar34 = vrcp14ss_avx512f(auVar16 << 0x20,ZEXT416(auVar33._0_4_));
              auVar33 = vfnmadd213ss_fma(auVar33,auVar34,SUB6416(ZEXT464(0x40000000),0));
              fVar77 = auVar34._0_4_ * auVar33._0_4_;
              auVar38 = vcvtdq2ps_avx(auVar38);
              fStack_9c4 = auVar38._28_4_ + local_a80._28_4_;
              auVar52 = vcvtdq2ps_avx(auVar52);
              auVar51 = vrcp14ps_avx512vl(local_a20);
              auVar13._8_4_ = 0x3f800000;
              auVar13._0_8_ = 0x3f8000003f800000;
              auVar13._12_4_ = 0x3f800000;
              auVar13._16_4_ = 0x3f800000;
              auVar13._20_4_ = 0x3f800000;
              auVar13._24_4_ = 0x3f800000;
              auVar13._28_4_ = 0x3f800000;
              auVar50 = vfnmadd213ps_avx512vl(local_a20,auVar51,auVar13);
              auVar33 = vfmadd132ps_fma(auVar50,auVar51,auVar51);
              fVar59 = auVar33._0_4_;
              fVar64 = auVar33._4_4_;
              local_9a0._4_4_ = fVar64 * local_a40._4_4_;
              local_9a0._0_4_ = fVar59 * local_a40._0_4_;
              fVar65 = auVar33._8_4_;
              local_9a0._8_4_ = fVar65 * local_a40._8_4_;
              fVar66 = auVar33._12_4_;
              local_9a0._12_4_ = fVar66 * local_a40._12_4_;
              local_9a0._16_4_ = fVar87 * 0.0;
              local_9a0._20_4_ = fVar88 * 0.0;
              local_9a0._24_4_ = fVar89 * 0.0;
              local_9a0._28_4_ = uVar20;
              local_9e0[0] = (fVar82 * auVar38._0_4_ + local_a80._0_4_) * fVar75 * fVar59;
              local_9e0[1] = (fVar84 * auVar38._4_4_ + local_a80._4_4_) * fVar75 * fVar64;
              local_9e0[2] = (fVar85 * auVar38._8_4_ + local_a80._8_4_) * fVar75 * fVar65;
              local_9e0[3] = (fVar86 * auVar38._12_4_ + local_a80._12_4_) * fVar75 * fVar66;
              fStack_9d0 = (fVar87 * auVar38._16_4_ + local_a80._16_4_) * fVar75 * 0.0;
              fStack_9cc = (fVar88 * auVar38._20_4_ + local_a80._20_4_) * fVar75 * 0.0;
              fStack_9c8 = (fVar89 * auVar38._24_4_ + local_a80._24_4_) * fVar75 * 0.0;
              local_9c0[0] = (fVar82 * auVar52._0_4_ + local_a60._0_4_) * fVar77 * fVar59;
              local_9c0[1] = (fVar84 * auVar52._4_4_ + local_a60._4_4_) * fVar77 * fVar64;
              local_9c0[2] = (fVar85 * auVar52._8_4_ + local_a60._8_4_) * fVar77 * fVar65;
              local_9c0[3] = (fVar86 * auVar52._12_4_ + local_a60._12_4_) * fVar77 * fVar66;
              fStack_9b0 = (fVar87 * auVar52._16_4_ + local_a60._16_4_) * fVar77 * 0.0;
              fStack_9ac = (fVar88 * auVar52._20_4_ + local_a60._20_4_) * fVar77 * 0.0;
              fStack_9a8 = (fVar89 * auVar52._24_4_ + local_a60._24_4_) * fVar77 * 0.0;
              fStack_9a4 = fStack_9c4;
              uVar25 = 0;
              uVar29 = (ulong)local_9ff;
              for (uVar22 = uVar29; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                uVar25 = uVar25 + 1;
              }
              local_b20 = vpbroadcastd_avx512vl();
              local_aa0 = vpbroadcastd_avx512vl();
              auVar36 = auVar93._0_16_;
              auVar68 = auVar94._0_16_;
              auVar54 = auVar95._0_16_;
              auVar55 = auVar96._0_16_;
              auVar56 = auVar97._0_16_;
              auVar33 = vmovdqa64_avx512vl(auVar98._0_16_);
              auVar34 = vmovdqa64_avx512vl(auVar99._0_16_);
              local_ac0 = vmovdqa64_avx512vl(auVar102._0_32_);
              local_ae0 = fVar90;
              fStack_adc = fVar90;
              fStack_ad8 = fVar90;
              fStack_ad4 = fVar90;
              fStack_ad0 = fVar90;
              fStack_acc = fVar90;
              fStack_ac8 = fVar90;
              fStack_ac4 = fVar90;
              while (uVar29 != 0) {
                fVar82 = local_9e0[uVar25];
                local_8c0._4_4_ = fVar82;
                local_8c0._0_4_ = fVar82;
                local_8c0._8_4_ = fVar82;
                local_8c0._12_4_ = fVar82;
                local_8c0._16_4_ = fVar82;
                local_8c0._20_4_ = fVar82;
                local_8c0._24_4_ = fVar82;
                local_8c0._28_4_ = fVar82;
                fVar82 = local_9c0[uVar25];
                local_8a0._4_4_ = fVar82;
                local_8a0._0_4_ = fVar82;
                local_8a0._8_4_ = fVar82;
                local_8a0._12_4_ = fVar82;
                local_8a0._16_4_ = fVar82;
                local_8a0._20_4_ = fVar82;
                local_8a0._24_4_ = fVar82;
                local_8a0._28_4_ = fVar82;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9a0 + uVar25 * 4);
                local_b50.context = context->user;
                local_920 = *(undefined4 *)(local_980 + uVar25 * 4);
                uVar2 = *(undefined4 *)(local_960 + uVar25 * 4);
                local_900._4_4_ = uVar2;
                local_900._0_4_ = uVar2;
                local_900._8_4_ = uVar2;
                local_900._12_4_ = uVar2;
                local_900._16_4_ = uVar2;
                local_900._20_4_ = uVar2;
                local_900._24_4_ = uVar2;
                local_900._28_4_ = uVar2;
                local_8e0 = *(undefined4 *)(local_940 + uVar25 * 4);
                uStack_91c = local_920;
                uStack_918 = local_920;
                uStack_914 = local_920;
                uStack_910 = local_920;
                uStack_90c = local_920;
                uStack_908 = local_920;
                uStack_904 = local_920;
                uStack_8dc = local_8e0;
                uStack_8d8 = local_8e0;
                uStack_8d4 = local_8e0;
                uStack_8d0 = local_8e0;
                uStack_8cc = local_8e0;
                uStack_8c8 = local_8e0;
                uStack_8c4 = local_8e0;
                local_880 = local_aa0._0_8_;
                uStack_878 = local_aa0._8_8_;
                uStack_870 = local_aa0._16_8_;
                uStack_868 = local_aa0._24_8_;
                local_860 = local_b20;
                vpcmpeqd_avx2(local_b20,local_b20);
                uStack_83c = (local_b50.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_b50.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_b00 = vmovdqa64_avx512vl(auVar102._0_32_);
                local_b50.valid = (int *)local_b00;
                local_b50.geometryUserPtr = pGVar3->userPtr;
                local_b50.hit = (RTCHitN *)&local_920;
                local_b50.N = 8;
                auVar38 = vmovdqa64_avx512vl(auVar102._0_32_);
                local_b50.ray = (RTCRayN *)ray;
                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar3->occlusionFilterN)(&local_b50);
                  auVar38 = vmovdqa64_avx512vl(local_ac0);
                  auVar102 = ZEXT3264(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar101 = ZEXT3264(auVar38);
                  auVar37 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                  auVar100 = ZEXT1664(auVar37);
                  auVar37 = vmovdqa64_avx512vl(auVar34);
                  auVar99 = ZEXT1664(auVar37);
                  auVar37 = vmovdqa64_avx512vl(auVar33);
                  auVar98 = ZEXT1664(auVar37);
                  auVar97 = ZEXT1664(auVar56);
                  auVar96 = ZEXT1664(auVar55);
                  auVar95 = ZEXT1664(auVar54);
                  auVar94 = ZEXT1664(auVar68);
                  auVar93 = ZEXT1664(auVar36);
                  auVar92 = ZEXT1664(auVar35);
                  auVar38 = local_b00;
                  fVar90 = local_ae0;
                }
                if (auVar38 != (undefined1  [32])0x0) {
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var6)(&local_b50);
                    auVar38 = vmovdqa64_avx512vl(local_ac0);
                    auVar102 = ZEXT3264(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar101 = ZEXT3264(auVar38);
                    auVar37 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                    auVar100 = ZEXT1664(auVar37);
                    auVar37 = vmovdqa64_avx512vl(auVar34);
                    auVar99 = ZEXT1664(auVar37);
                    auVar37 = vmovdqa64_avx512vl(auVar33);
                    auVar98 = ZEXT1664(auVar37);
                    auVar97 = ZEXT1664(auVar56);
                    auVar96 = ZEXT1664(auVar55);
                    auVar95 = ZEXT1664(auVar54);
                    auVar94 = ZEXT1664(auVar68);
                    auVar93 = ZEXT1664(auVar36);
                    auVar92 = ZEXT1664(auVar35);
                    fVar90 = local_ae0;
                    auVar38 = local_b00;
                  }
                  uVar22 = vptestmd_avx512vl(auVar38,auVar38);
                  auVar52 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar7 = (bool)((byte)uVar22 & 1);
                  auVar53._0_4_ =
                       (uint)bVar7 * auVar52._0_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x100);
                  bVar7 = (bool)((byte)(uVar22 >> 1) & 1);
                  auVar53._4_4_ =
                       (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x104);
                  bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
                  auVar53._8_4_ =
                       (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x108);
                  bVar7 = (bool)((byte)(uVar22 >> 3) & 1);
                  auVar53._12_4_ =
                       (uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x10c)
                  ;
                  bVar7 = (bool)((byte)(uVar22 >> 4) & 1);
                  auVar53._16_4_ =
                       (uint)bVar7 * auVar52._16_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x110)
                  ;
                  bVar7 = (bool)((byte)(uVar22 >> 5) & 1);
                  auVar53._20_4_ =
                       (uint)bVar7 * auVar52._20_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x114)
                  ;
                  bVar7 = (bool)((byte)(uVar22 >> 6) & 1);
                  auVar53._24_4_ =
                       (uint)bVar7 * auVar52._24_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x118)
                  ;
                  bVar7 = SUB81(uVar22 >> 7,0);
                  auVar53._28_4_ =
                       (uint)bVar7 * auVar52._28_4_ | (uint)!bVar7 * *(int *)(local_b50.ray + 0x11c)
                  ;
                  *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar53;
                  if (auVar38 != (undefined1  [32])0x0) goto LAB_01d64530;
                }
                *(float *)(ray + k * 4 + 0x100) = fVar90;
                uVar22 = uVar25 & 0x3f;
                uVar25 = 0;
                uVar29 = uVar29 ^ 1L << uVar22;
                for (uVar22 = uVar29; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  uVar25 = uVar25 + 1;
                }
              }
            }
          }
        }
      }
      unaff_R12 = 0;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }